

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O1

Vec_Ptr_t * Bac_NtkTransformToPtr(Bac_Ntk_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  char *pcVar3;
  Vec_Ptr_t *pVVar4;
  undefined8 *puVar5;
  
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 5;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x28);
  pVVar1->pArray = ppvVar2;
  pcVar3 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  ppvVar2 = pVVar1->pArray;
  pVVar1->nSize = 1;
  *ppvVar2 = pcVar3;
  pVVar4 = Bac_NtkTransformToPtrInputs(p);
  if (pVVar1->nCap == 1) {
    ppvVar2 = (void **)realloc(ppvVar2,0x80);
    pVVar1->pArray = ppvVar2;
    pVVar1->nCap = 0x10;
  }
  ppvVar2 = pVVar1->pArray;
  pVVar1->nSize = 2;
  ppvVar2[1] = pVVar4;
  pVVar4 = Bac_NtkTransformToPtrOutputs(p);
  if (pVVar1->nCap == 2) {
    if (ppvVar2 == (void **)0x0) {
      ppvVar2 = (void **)malloc(0x80);
    }
    else {
      ppvVar2 = (void **)realloc(ppvVar2,0x80);
    }
    pVVar1->pArray = ppvVar2;
    pVVar1->nCap = 0x10;
  }
  ppvVar2 = pVVar1->pArray;
  pVVar1->nSize = 3;
  ppvVar2[2] = pVVar4;
  puVar5 = (undefined8 *)malloc(0x10);
  *puVar5 = 0;
  puVar5[1] = 0;
  if (pVVar1->nCap == 3) {
    if (ppvVar2 == (void **)0x0) {
      ppvVar2 = (void **)malloc(0x80);
    }
    else {
      ppvVar2 = (void **)realloc(ppvVar2,0x80);
    }
    pVVar1->pArray = ppvVar2;
    pVVar1->nCap = 0x10;
  }
  ppvVar2 = pVVar1->pArray;
  pVVar1->nSize = 4;
  ppvVar2[3] = puVar5;
  pVVar4 = Bac_NtkTransformToPtrBoxes(p);
  if (pVVar1->nCap == 4) {
    if (ppvVar2 == (void **)0x0) {
      ppvVar2 = (void **)malloc(0x80);
    }
    else {
      ppvVar2 = (void **)realloc(ppvVar2,0x80);
    }
    pVVar1->pArray = ppvVar2;
    pVVar1->nCap = 0x10;
  }
  pVVar1->nSize = 5;
  pVVar1->pArray[4] = pVVar4;
  if (pVVar1->nCap == 5) {
    return pVVar1;
  }
  __assert_fail("Vec_PtrSize(vArray) == Vec_PtrCap(vArray)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                ,0x6b,"int Ptr_CheckArray(Vec_Ptr_t *)");
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtr( Bac_Ntk_t * p )
{
    Vec_Ptr_t * vNtk = Vec_PtrAllocExact(5);
    Vec_PtrPush( vNtk, Bac_NtkName(p) );
    Vec_PtrPush( vNtk, Bac_NtkTransformToPtrInputs(p) );
    Vec_PtrPush( vNtk, Bac_NtkTransformToPtrOutputs(p) );
    Vec_PtrPush( vNtk, Vec_PtrAllocExact(0) );
    Vec_PtrPush( vNtk, Bac_NtkTransformToPtrBoxes(p) );
    assert( Ptr_CheckArray(vNtk) );
    return vNtk;
}